

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O3

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx,MppMeta meta)

{
  ushort uVar1;
  RK_U32 RVar2;
  void *__s;
  long lVar3;
  byte bVar4;
  int iVar5;
  Vepu580RoiH265BsCfg val;
  RK_U32 offset_1;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  undefined1 *puVar12;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  ushort uVar17;
  ushort uVar18;
  ulong uVar19;
  ulong uVar20;
  RK_U32 *buf;
  ulong uVar21;
  Vepu580RoiQpCfg *qp_cfg_base;
  void *pvVar22;
  bool bVar23;
  RK_S32 cu16_num_line;
  
  iVar5 = *(int *)((long)ctx + 0x20);
  if (iVar5 == 0x10) {
    lVar3 = *(long *)((long)ctx + 0x38);
    iVar5 = *(int *)((long)ctx + 0x1c);
    if (0 < (long)iVar5) {
      lVar9 = *(long *)((long)ctx + 0x10);
      puVar12 = (undefined1 *)(lVar3 + 0xf);
      lVar15 = 0;
      do {
        *(undefined8 *)(puVar12 + -0xf) = *(undefined8 *)(lVar9 + lVar15);
        *(undefined2 *)(puVar12 + -7) = *(undefined2 *)(lVar9 + 8 + lVar15);
        *puVar12 = *(undefined1 *)(lVar9 + 0xc + lVar15);
        *(undefined2 *)(puVar12 + -5) = *(undefined2 *)(lVar9 + 0x10 + lVar15);
        puVar12[-1] = 1;
        *(undefined2 *)(puVar12 + -3) = 0;
        puVar12 = puVar12 + 0x10;
        lVar15 = lVar15 + 0x14;
      } while ((long)iVar5 * 0x14 != lVar15);
    }
    *(int *)((long)ctx + 0x28) = iVar5;
    *(long *)((long)ctx + 0x30) = lVar3;
    mpp_meta_set_ptr(meta,0x726f6920,(long)ctx + 0x28);
  }
  else {
    if (iVar5 == 2) {
      gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        lVar3 = *(long *)((long)ctx + 0xb8);
        pvVar22 = *(void **)((long)ctx + 0x80);
        buf = *(RK_U32 **)((long)ctx + 0x78);
        if (buf != (RK_U32 *)0x0 && (pvVar22 != (void *)0x0 && lVar3 != 0)) {
          uVar11 = *ctx + 0x3f >> 6;
          uVar8 = *(int *)((long)ctx + 4) + 0x3f >> 6;
          memset(pvVar22,0,(long)(int)(uVar8 * uVar11 * 0x100));
          memset(buf,0,(long)(int)(uVar8 * uVar11 * 0x40));
          if (0 < (int)uVar8) {
            uVar16 = 0;
            do {
              if (0 < (int)uVar11) {
                uVar19 = 0;
                do {
                  if (*(char *)(uVar16 * uVar11 + *(long *)((long)ctx + 0xa8) + uVar19) != '\0') {
                    uVar20 = 0;
                    iVar5 = 0;
                    do {
                      uVar13 = (ulong)((((uint)(uVar20 >> 2) & 0x3fffffff) + (int)uVar16 * 4) *
                                       uVar11 * 4 + ((uint)uVar20 & 3 | (int)uVar19 * 4));
                      RVar2 = raster2zscan16[uVar20];
                      uVar1 = *(ushort *)(lVar3 + uVar13 * 2);
                      bVar10 = (char)uVar1 * '\b' & 8;
                      bVar23 = (uVar1 & 0x7f00) != 0;
                      val = (Vepu580RoiH265BsCfg)(bVar23 * '\x02' | bVar10);
                      bVar10 = bVar10 >> 3;
                      iVar5 = (uint)(bVar23 | bVar10) + iVar5;
                      set_roi_cu16_split_cu8(buf,(uint)uVar20,val);
                      uVar7 = (uint)bVar23;
                      buf[RVar2 + 0x1e9 >> 5] =
                           buf[RVar2 + 0x1e9 >> 5] | uVar7 << ((byte)(RVar2 + 0x1e9) & 0x1f);
                      uVar6 = RVar2 * 2 + 0x12a;
                      buf[uVar6 >> 5] = buf[uVar6 >> 5] | (uint)bVar10 << ((byte)uVar6 & 0x1f);
                      uVar21 = (ulong)(RVar2 + 0x40);
                      uVar17 = *(ushort *)(lVar3 + uVar13 * 2) & 0x7f00;
                      uVar1 = *(ushort *)((long)pvVar22 + uVar21 * 2);
                      *(ushort *)((long)pvVar22 + uVar21 * 2) = uVar1 & 0x80ff | uVar17;
                      uVar18 = *(ushort *)(lVar3 + uVar13 * 2) & 0x8000;
                      *(ushort *)((long)pvVar22 + uVar21 * 2) = uVar1 & 0xff | uVar17 | uVar18;
                      *(ushort *)((long)pvVar22 + uVar21 * 2) =
                           uVar1 & 0xf | uVar17 | uVar18 | *(ushort *)(lVar3 + uVar13 * 2) & 0x70;
                      if ((uVar20 == 0xf) && (iVar5 == 0x10)) {
                        buf[0xf] = buf[0xf] | uVar7 << 0x1d;
                        buf[10] = buf[10] | (uint)bVar10 << 0x12;
                        uVar17 = *(ushort *)(lVar3 + uVar13 * 2) & 0x7f00;
                        uVar1 = *(ushort *)((long)pvVar22 + 0xa8);
                        *(ushort *)((long)pvVar22 + 0xa8) = uVar1 & 0x80ff | uVar17;
                        uVar18 = *(ushort *)(lVar3 + uVar13 * 2) & 0x8000;
                        *(ushort *)((long)pvVar22 + 0xa8) = uVar1 & 0xff | uVar17 | uVar18;
                        *(ushort *)((long)pvVar22 + 0xa8) =
                             uVar1 & 0xf | uVar17 | uVar18 | *(ushort *)(lVar3 + uVar13 * 2) & 0x70;
                        lVar9 = 0x50;
                        bVar4 = 10;
                        do {
                          buf[0xf] = buf[0xf] | uVar7 << ((char)lVar9 - 0x37U & 0x1f);
                          buf[10] = buf[10] | (uint)bVar10 << (bVar4 & 0x1f);
                          uVar17 = *(ushort *)(lVar3 + uVar13 * 2) & 0x7f00;
                          uVar1 = *(ushort *)((long)pvVar22 + lVar9 * 2);
                          *(ushort *)((long)pvVar22 + lVar9 * 2) = uVar1 & 0x80ff | uVar17;
                          uVar18 = *(ushort *)(lVar3 + uVar13 * 2) & 0x8000;
                          *(ushort *)((long)pvVar22 + lVar9 * 2) = uVar1 & 0xff | uVar17 | uVar18;
                          *(ushort *)((long)pvVar22 + lVar9 * 2) =
                               uVar1 & 0xf | uVar17 | uVar18 |
                               *(ushort *)(lVar3 + uVar13 * 2) & 0x70;
                          lVar9 = lVar9 + 1;
                          bVar4 = bVar4 + 2;
                        } while (lVar9 != 0x54);
                        lVar9 = 0;
                        do {
                          set_roi_cu8_base_cfg(buf,(RK_U32)lVar9,val);
                          uVar17 = *(ushort *)(lVar3 + uVar13 * 2) & 0x7f00;
                          uVar1 = *(ushort *)((long)pvVar22 + lVar9 * 2);
                          *(ushort *)((long)pvVar22 + lVar9 * 2) = uVar1 & 0x80ff | uVar17;
                          uVar18 = *(ushort *)(lVar3 + uVar13 * 2) & 0x8000;
                          *(ushort *)((long)pvVar22 + lVar9 * 2) = uVar1 & 0xff | uVar17 | uVar18;
                          *(ushort *)((long)pvVar22 + lVar9 * 2) =
                               uVar1 & 0xf | uVar17 | uVar18 |
                               *(ushort *)(lVar3 + uVar13 * 2) & 0x70;
                          lVar9 = lVar9 + 1;
                        } while (lVar9 != 0x40);
                      }
                      else if ((uVar20 == 0xf) && (iVar5 != 0)) {
                        buf[0xd] = buf[0xd] | 0x1f0;
                        uVar6 = 0x194;
                        do {
                          buf[uVar6 >> 5] = buf[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
                          uVar6 = uVar6 + 1;
                        } while (uVar6 != 0x1a4);
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != 0x10);
                  }
                  buf = buf + 0x10;
                  pvVar22 = (void *)((long)pvVar22 + 0xc0);
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar11);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar8);
          }
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        lVar3 = *(long *)((long)ctx + 0xb8);
        pvVar22 = *(void **)((long)ctx + 0x80);
        __s = *(void **)((long)ctx + 0x78);
        if (__s != (void *)0x0 && (pvVar22 != (void *)0x0 && lVar3 != 0)) {
          uVar8 = *(int *)((long)ctx + 4) + 0xf >> 4;
          uVar11 = (*ctx + 0xf >> 4) + 3U & 0xfffffffc;
          iVar5 = (uVar8 + 3 & 0xfffffffc) * uVar11;
          memset(__s,0,(long)(iVar5 * 8));
          memset(pvVar22,0,(long)(iVar5 * 2));
          if (0 < (int)uVar8) {
            lVar9 = 0;
            uVar16 = 0;
            do {
              lVar15 = lVar9;
              uVar19 = (ulong)uVar11;
              if (0 < (int)uVar11) {
                do {
                  if (*(char *)(*(long *)((long)ctx + 0xa8) + lVar15) != '\0') {
                    uVar17 = *(ushort *)(lVar3 + lVar15 * 2) & 0x7f00;
                    uVar1 = *(ushort *)((long)pvVar22 + lVar15 * 2);
                    *(ushort *)((long)pvVar22 + lVar15 * 2) = uVar1 & 0x80ff | uVar17;
                    uVar18 = *(ushort *)(lVar3 + lVar15 * 2) & 0x8000;
                    *(ushort *)((long)pvVar22 + lVar15 * 2) = uVar1 & 0xff | uVar17 | uVar18;
                    *(ushort *)((long)pvVar22 + lVar15 * 2) =
                         uVar1 & 0xf | uVar17 | uVar18 | *(ushort *)(lVar3 + lVar15 * 2) & 0x70;
                    uVar21 = (ulong)(*(ushort *)(lVar3 + lVar15 * 2) & 1) << 0x3d;
                    uVar20 = *(ulong *)((long)__s + lVar15 * 8);
                    *(ulong *)((long)__s + lVar15 * 8) = uVar20 & 0xdfffffffffffffff | uVar21;
                    *(ulong *)((long)__s + lVar15 * 8) =
                         uVar20 & 0x9fffffffffffffff | uVar21 |
                         (ulong)((*(ushort *)(lVar3 + lVar15 * 2) & 0x7f00) != 0) << 0x3e;
                  }
                  uVar19 = uVar19 - 1;
                  lVar15 = lVar15 + 1;
                } while (uVar19 != 0);
              }
              uVar16 = uVar16 + 1;
              lVar9 = lVar9 + (ulong)uVar11;
            } while (uVar16 != uVar8);
          }
        }
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x48),1,"mpp_enc_roi_setup_meta");
      uVar14 = *(undefined8 *)((long)ctx + 0x50);
    }
    else {
      if (iVar5 != 1) goto LAB_0010a3b2;
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
        uVar11 = *(int *)((long)ctx + 4) + 0x3f >> 6;
        if (0 < (int)uVar11) {
          lVar3 = *(long *)((long)ctx + 0x78);
          lVar9 = *(long *)((long)ctx + 0xb8);
          uVar8 = *ctx + 0x3f >> 6;
          uVar16 = 0;
          uVar19 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar20 = uVar16 >> 4;
              uVar21 = 0;
              do {
                uVar13 = 0;
                do {
                  *(undefined2 *)((ulong)((uint)uVar20 & 0xfffffff) * 0x20 + lVar3 + uVar13 * 2) =
                       *(undefined2 *)
                        (lVar9 + (ulong)((((uint)(uVar13 >> 2) & 0x3fffffff) + (int)uVar19 * 4) *
                                         uVar8 * 4 + ((uint)uVar13 & 3 | (int)uVar21 * 4)) * 2);
                  uVar13 = uVar13 + 1;
                } while (uVar13 != 0x10);
                uVar21 = uVar21 + 1;
                uVar20 = (ulong)((uint)uVar20 + 1);
              } while (uVar21 != uVar8);
            }
            uVar19 = uVar19 + 1;
            uVar16 = uVar16 + (ulong)uVar8 * 0x10;
          } while (uVar19 != uVar11);
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0x78));
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      uVar14 = *(undefined8 *)((long)ctx + 0x48);
    }
    mpp_buffer_sync_end_f(uVar14,1,"mpp_enc_roi_setup_meta");
  }
LAB_0010a3b2:
  *(undefined4 *)((long)ctx + 0x1c) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx, MppMeta meta)
{
    MppEncRoiImpl *impl = (MppEncRoiImpl *)ctx;

    switch (impl->roi_type) {
    case ROI_TYPE_1 : {
        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu54x_roi(impl, impl->dst_base);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu54x_roi(impl, impl->tmp);
            vepu54x_h265_set_roi(impl->dst_base, impl->tmp, impl->w, impl->h);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
    } break;
    case ROI_TYPE_2 : {
        gen_vepu54x_roi(impl, impl->tmp);

        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu580_roi_h264(impl);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu580_roi_h265(impl);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
        mpp_buffer_sync_ro_end(impl->roi_cfg.qp_cfg_buf);
    } break;
    case ROI_TYPE_LEGACY : {
        MppEncROIRegion *region = impl->legacy_roi_region;
        MppEncROICfg *roi_cfg = &impl->legacy_roi_cfg;
        RoiRegionCfg *regions = impl->regions;
        RK_S32 i;

        for (i = 0; i < impl->count; i++) {
            region[i].x = regions[i].x;
            region[i].y = regions[i].y;
            region[i].w = regions[i].w;
            region[i].h = regions[i].h;

            region[i].intra = regions[i].force_intra;
            region[i].abs_qp_en = regions[i].qp_mode;
            region[i].quality = regions[i].qp_val;
            region[i].area_map_en = 1;
            region[i].qp_area_idx = 0;
        }

        roi_cfg->number = impl->count;
        roi_cfg->regions = region;

        mpp_meta_set_ptr(meta, KEY_ROI_DATA, (void*)roi_cfg);
    } break;
    default : {
    } break;
    }

    impl->count = 0;

    return MPP_OK;
}